

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLchar * gl4cts::EnhancedLayouts::Utils::Buffer::GetBufferName(BUFFERS buffer)

{
  TestError *this;
  char *local_18;
  GLchar *name;
  BUFFERS buffer_local;
  
  switch(buffer) {
  case Array:
    local_18 = "Array";
    break;
  case Element:
    local_18 = "Element";
    break;
  case Shader_Storage:
    local_18 = "Shader_Storage";
    break;
  case Texture:
    local_18 = "Texture";
    break;
  case Transform_feedback:
    local_18 = "Transform_feedback";
    break;
  case Uniform:
    local_18 = "Uniform";
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x7fc);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_18;
}

Assistant:

const GLchar* Buffer::GetBufferName(BUFFERS buffer)
{
	const GLchar* name = 0;

	switch (buffer)
	{
	case Array:
		name = "Array";
		break;
	case Element:
		name = "Element";
		break;
	case Shader_Storage:
		name = "Shader_Storage";
		break;
	case Texture:
		name = "Texture";
		break;
	case Transform_feedback:
		name = "Transform_feedback";
		break;
	case Uniform:
		name = "Uniform";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return name;
}